

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O1

cx_string<19UL> * __thiscall
mserialize::cx_strcat<1ul,1ul,9ul,1ul,6ul,1ul>
          (cx_string<19UL> *__return_storage_ptr__,mserialize *this,cx_string<1UL> *strings,
          cx_string<1UL> *strings_1,cx_string<9UL> *strings_2,cx_string<1UL> *strings_3,
          cx_string<6UL> *strings_4,cx_string<1UL> *strings_5)

{
  long lVar1;
  ulong uVar2;
  size_t *psVar3;
  ulong local_98 [3];
  size_t size [7];
  char buffer [20];
  
  psVar3 = size + 5;
  size[5] = 0;
  size[6]._0_7_ = 0;
  stack0xffffffffffffffb7 = 0;
  stack0xffffffffffffffd0 = this;
  lVar1 = 1;
  local_98[1] = 1;
  local_98[2] = 1;
  size[0] = 9;
  size[1] = 1;
  size[2] = 6;
  size[3] = 1;
  do {
    if (local_98[lVar1] != 0) {
      uVar2 = 0;
      do {
        *(undefined1 *)((long)psVar3 + uVar2) =
             *(undefined1 *)(*(long *)(buffer + lVar1 * 8 + 8) + uVar2);
        uVar2 = uVar2 + 1;
      } while (uVar2 < local_98[lVar1]);
      psVar3 = (size_t *)((long)psVar3 + uVar2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  __return_storage_ptr__->_data[0x13] = '\0';
  *(size_t *)__return_storage_ptr__->_data = size[5];
  *(ulong *)(__return_storage_ptr__->_data + 8) = CONCAT17(size[6]._7_1_,(undefined7)size[6]);
  *(undefined4 *)(__return_storage_ptr__->_data + 0xf) = stack0xffffffffffffffb7;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}